

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeventqueue.h
# Opt level: O1

xcb_generic_event_t * __thiscall
QXcbEventQueue::peek<QXcbConnection::compressEvent(xcb_generic_event_t*)const::__2>
          (QXcbEventQueue *this,PeekOption option,anon_class_16_2_e8808096 *peeker)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  xcb_generic_event_t *unaff_R15;
  xcb_generic_event_t *pxVar5;
  
  flushBufferedEvents(this);
  plVar4 = *(long **)(this + 0x10);
  if ((plVar4 != *(long **)(this + 0x18)) || (*plVar4 != 0)) {
    do {
      pxVar5 = (xcb_generic_event_t *)*plVar4;
      if ((pxVar5 == (xcb_generic_event_t *)0x0) ||
         ((bVar1 = QXcbBasicConnection::isXIType
                             (*(QXcbBasicConnection **)CONCAT44(in_register_00000034,option),pxVar5,
                              0x13), !bVar1 ||
          (uVar3 = pxVar5->pad[3] / 0x7fffffff, iVar2 = 1,
          *(int *)((undefined8 *)CONCAT44(in_register_00000034,option))[1] !=
          (uVar3 << 0x1f | uVar3) + pxVar5->pad[3])))) {
        pxVar5 = unaff_R15;
        if (plVar4 == *(long **)(this + 0x18)) {
          iVar2 = 2;
        }
        else {
          plVar4 = (long *)plVar4[1];
          iVar2 = 0;
        }
      }
      unaff_R15 = pxVar5;
    } while (iVar2 == 0);
    if (iVar2 != 2) {
      return pxVar5;
    }
  }
  return (xcb_generic_event_t *)0x0;
}

Assistant:

xcb_generic_event_t *QXcbEventQueue::peek(PeekOption option, Peeker &&peeker)
{
    flushBufferedEvents();
    if (isEmpty())
        return nullptr;

    QXcbEventNode *node = m_head;
    do {
        xcb_generic_event_t *event = node->event;
        if (event && peeker(event, event->response_type & ~0x80)) {
            if (option == PeekConsumeMatch || option == PeekConsumeMatchAndContinue)
                node->event = nullptr;

            if (option != PeekConsumeMatchAndContinue)
                return event;
        }
        if (node == m_flushedTail)
            break;
        node = node->next;
    } while (true);

    return nullptr;
}